

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsP2pkhScript(Script *this)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  ScriptOperator *pSVar5;
  bool local_11;
  Script *this_local;
  
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  local_11 = false;
  if (sVar2 == 0x19) {
    sVar3 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                      (&this->script_stack_);
    local_11 = false;
    if (sVar3 == 5) {
      pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,0);
      pSVar5 = ScriptElement::GetOpCode(pvVar4);
      bVar1 = ScriptOperator::operator==(pSVar5,(ScriptOperator *)ScriptOperator::OP_DUP);
      local_11 = false;
      if (bVar1) {
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,1);
        pSVar5 = ScriptElement::GetOpCode(pvVar4);
        bVar1 = ScriptOperator::operator==(pSVar5,(ScriptOperator *)ScriptOperator::OP_HASH160);
        local_11 = false;
        if (bVar1) {
          pvVar4 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[](&this->script_stack_,2);
          bVar1 = ScriptElement::IsBinary(pvVar4);
          local_11 = false;
          if (bVar1) {
            pvVar4 = ::std::
                     vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                     operator[](&this->script_stack_,3);
            pSVar5 = ScriptElement::GetOpCode(pvVar4);
            bVar1 = ScriptOperator::operator==
                              (pSVar5,(ScriptOperator *)ScriptOperator::OP_EQUALVERIFY);
            local_11 = false;
            if (bVar1) {
              pvVar4 = ::std::
                       vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                       operator[](&this->script_stack_,4);
              pSVar5 = ScriptElement::GetOpCode(pvVar4);
              local_11 = ScriptOperator::operator==
                                   (pSVar5,(ScriptOperator *)ScriptOperator::OP_CHECKSIG);
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Script::IsP2pkhScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2pkhLength &&
      script_stack_.size() == 5 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_DUP &&
      script_stack_[1].GetOpCode() == ScriptOperator::OP_HASH160 &&
      script_stack_[2].IsBinary() &&
      script_stack_[3].GetOpCode() == ScriptOperator::OP_EQUALVERIFY &&
      script_stack_[4].GetOpCode() == ScriptOperator::OP_CHECKSIG);
}